

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_unmark_tet(REF_SUBDIV ref_subdiv,REF_INT cell,REF_BOOL *again)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  REF_CELL ref_cell;
  REF_INT *pRVar6;
  REF_INT RVar7;
  
  ref_cell = ref_subdiv->grid->cell[8];
  ref_subdiv_unmark_tet_face(ref_subdiv,ref_cell,cell,again,3,4,5);
  ref_subdiv_unmark_tet_face(ref_subdiv,ref_cell,cell,again,1,2,5);
  ref_subdiv_unmark_tet_face(ref_subdiv,ref_cell,cell,again,0,4,2);
  ref_subdiv_unmark_tet_face(ref_subdiv,ref_cell,cell,again,0,1,3);
  pRVar6 = ref_subdiv->mark;
  RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
  iVar1 = pRVar6[RVar7];
  pRVar6 = ref_subdiv->mark;
  RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
  iVar2 = pRVar6[RVar7];
  pRVar6 = ref_subdiv->mark;
  RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
  iVar3 = pRVar6[RVar7];
  pRVar6 = ref_subdiv->mark;
  RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
  iVar4 = pRVar6[RVar7];
  pRVar6 = ref_subdiv->mark;
  RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
  iVar5 = pRVar6[RVar7];
  pRVar6 = ref_subdiv->mark;
  RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
  if (iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + pRVar6[RVar7] == 2) {
    ref_subdiv_unmark_tet_opp_edge(ref_subdiv,ref_cell,cell,again,0,5);
    ref_subdiv_unmark_tet_opp_edge(ref_subdiv,ref_cell,cell,again,1,4);
    ref_subdiv_unmark_tet_opp_edge(ref_subdiv,ref_cell,cell,again,2,3);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_unmark_tet(REF_SUBDIV ref_subdiv, REF_INT cell,
                                         REF_BOOL *again) {
  REF_CELL ref_cell = ref_grid_tet(ref_subdiv_grid(ref_subdiv));
  REF_INT sum;

  RSS(ref_subdiv_unmark_tet_face(ref_subdiv, ref_cell, cell, again, 3, 4, 5),
      "face 0");
  RSS(ref_subdiv_unmark_tet_face(ref_subdiv, ref_cell, cell, again, 1, 2, 5),
      "face 1");
  RSS(ref_subdiv_unmark_tet_face(ref_subdiv, ref_cell, cell, again, 0, 4, 2),
      "face 2");
  RSS(ref_subdiv_unmark_tet_face(ref_subdiv, ref_cell, cell, again, 0, 1, 3),
      "face 3");

  sum = ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 0, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 1, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 2, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 3, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 4, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 5, cell));

  if (2 == sum) {
    RSS(ref_subdiv_unmark_tet_opp_edge(ref_subdiv, ref_cell, cell, again, 0, 5),
        "edges 0-5");
    RSS(ref_subdiv_unmark_tet_opp_edge(ref_subdiv, ref_cell, cell, again, 1, 4),
        "edges 1-4");
    RSS(ref_subdiv_unmark_tet_opp_edge(ref_subdiv, ref_cell, cell, again, 2, 3),
        "edges 2-3");
  }

  return REF_SUCCESS;
}